

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_Constractor_hex0_Test::~ConfidentialValue_Constractor_hex0_Test
          (ConfidentialValue_Constractor_hex0_Test *this)

{
  ConfidentialValue_Constractor_hex0_Test *this_local;
  
  ~ConfidentialValue_Constractor_hex0_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_hex0) {
  // 0byte
  ConfidentialValue value("");
  EXPECT_STREQ(value.GetHex().c_str(), "");
  EXPECT_EQ(value.GetData().GetDataSize(), 0);
  EXPECT_EQ(value.HasBlinding(), false);
  int64_t satoshi = 0;
  EXPECT_NO_THROW((satoshi = value.GetAmount().GetSatoshiValue()));
  EXPECT_EQ(satoshi, 0);
}